

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetUserData(void *arkode_mem,void *user_data)

{
  void *in_RSI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeARKStepMem *)0xe85ef9);
  if ((((local_4 == 0) &&
       (local_4 = arkSetUserData(in_stack_ffffffffffffffd8,(void *)(ulong)in_stack_ffffffffffffffd0)
       , local_4 == 0)) &&
      ((*(long *)((long)in_stack_ffffffffffffffd8 + 0x128) == 0 ||
       (local_4 = arkLSSetUserData(in_RSI,in_stack_ffffffffffffffe0), local_4 == 0)))) &&
     ((*(long *)((long)in_stack_ffffffffffffffd8 + 0x160) == 0 ||
      (local_4 = arkLSSetMassUserData(in_RSI,in_stack_ffffffffffffffe0), local_4 == 0)))) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKStepSetUserData(void *arkode_mem, void *user_data)
{
  ARKodeMem        ark_mem;
  ARKodeARKStepMem step_mem;
  int              retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetUserData",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* set user_data in ARKode mem */
  retval = arkSetUserData(arkode_mem, user_data);
  if (retval != ARK_SUCCESS) return(retval);

  /* set user data in ARKodeLS mem */
  if (step_mem->lmem != NULL) {
    retval = arkLSSetUserData(arkode_mem, user_data);
    if (retval != ARKLS_SUCCESS) return(retval);
  }

  /* set user data in ARKodeLSMass mem */
  if (step_mem->mass_mem != NULL) {
    retval = arkLSSetMassUserData(arkode_mem, user_data);
    if (retval != ARKLS_SUCCESS) return(retval);
  }

  return(ARK_SUCCESS);
}